

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_txfm_sse4.c
# Opt level: O0

void av1_round_shift_array_sse4_1(int32_t *arr,int size,int bit)

{
  undefined4 in_EDX;
  int in_ESI;
  __m128i *in_RDI;
  int vec_size;
  __m128i *vec;
  int in_stack_ffffffffffffffe0;
  
  av1_round_shift_array_32_sse4_1
            ((__m128i *)CONCAT44(in_ESI,in_EDX),in_RDI,in_ESI >> 2,in_stack_ffffffffffffffe0);
  return;
}

Assistant:

void av1_round_shift_array_sse4_1(int32_t *arr, int size, int bit) {
  __m128i *const vec = (__m128i *)arr;
  const int vec_size = size >> 2;
  av1_round_shift_array_32_sse4_1(vec, vec, vec_size, bit);
}